

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

void proto2_unittest::PackedInt32::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  PackedInt32 **v1;
  PackedInt32 **v2;
  char *failure_msg;
  LogMessage *pLVar1;
  RepeatedField<int> *this;
  RepeatedField<int> *other;
  uint32_t cached_has_bits;
  LogMessage local_50;
  Voidify local_39;
  PackedInt32 *local_38;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  PackedInt32 *from;
  PackedInt32 *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  
  local_38 = (PackedInt32 *)from_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)from_msg;
  from = (PackedInt32 *)to_msg;
  _this = (PackedInt32 *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue<proto2_unittest::PackedInt32_const*>
                 (&local_38);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<proto2_unittest::PackedInt32*>(&from)
  ;
  local_30 = absl::lts_20250127::log_internal::
             Check_NEImpl<proto2_unittest::PackedInt32_const*,proto2_unittest::PackedInt32*>
                       (v1,v2,"&from != _this");
  if (local_30 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_30);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_lite.pb.cc"
               ,0x2f58,failure_msg);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_50);
  }
  this = _internal_mutable_repeated_int32(from);
  other = _internal_repeated_int32((PackedInt32 *)absl_log_internal_check_op_result);
  google::protobuf::RepeatedField<int>::MergeFrom(this,other);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(from->super_MessageLite)._internal_metadata_,
             (InternalMetadata *)(absl_log_internal_check_op_result + 8));
  return;
}

Assistant:

void PackedInt32::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<PackedInt32*>(&to_msg);
  auto& from = static_cast<const PackedInt32&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.PackedInt32)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_repeated_int32()->MergeFrom(from._internal_repeated_int32());
  _this->_internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}